

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O1

int __thiscall embree::Scene::bind(Scene *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  Geometry *pGVar1;
  Device *pDVar2;
  float **ppfVar3;
  uint *ptr;
  Ref<embree::Geometry> *pRVar4;
  bool bVar5;
  int iVar6;
  size_t i;
  undefined8 *puVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  uint *puVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  Lock<embree::MutexSys> lock;
  undefined1 *local_60;
  long local_58;
  undefined1 local_50 [16];
  MutexSys *local_40;
  char local_38;
  
  local_40 = &this->geometriesMutex;
  local_38 = '\x01';
  MutexSys::lock(local_40);
  if (__fd == -1) {
    __fd = IDPool<unsigned_int,_4294967294UL>::allocate(&this->id_pool);
    if (__fd == 0xffffffff) {
      puVar7 = (undefined8 *)__cxa_allocate_exception(0x30);
      local_60 = local_50;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_60,"too many geometries inside scene","");
      *puVar7 = &PTR__rtcore_error_022018b0;
      *(undefined4 *)(puVar7 + 1) = 3;
      puVar7[2] = puVar7 + 4;
      std::__cxx11::string::_M_construct<char*>((string *)(puVar7 + 2),local_60,local_60 + local_58)
      ;
      __cxa_throw(puVar7,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
    }
  }
  else {
    bVar5 = IDPool<unsigned_int,_4294967294UL>::add(&this->id_pool,__fd);
    if (!bVar5) {
      puVar7 = (undefined8 *)__cxa_allocate_exception(0x30);
      local_60 = local_50;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_60,"invalid geometry ID provided","");
      *puVar7 = &PTR__rtcore_error_022018b0;
      *(undefined4 *)(puVar7 + 1) = 3;
      puVar7[2] = puVar7 + 4;
      std::__cxx11::string::_M_construct<char*>((string *)(puVar7 + 2),local_60,local_60 + local_58)
      ;
      __cxa_throw(puVar7,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
    }
  }
  uVar13 = (ulong)(uint)__fd;
  uVar11 = (this->geometries).size_active;
  if (uVar11 <= uVar13) {
    uVar12 = (ulong)(__fd + 1);
    uVar9 = (this->geometries).size_alloced;
    uVar10 = uVar9;
    if ((uVar9 < uVar12) && (uVar10 = uVar12, uVar9 != 0)) {
      while (uVar10 = uVar9, uVar10 < uVar12) {
        uVar9 = uVar10 * 2 + (ulong)(uVar10 * 2 == 0);
      }
    }
    if (uVar12 < uVar11) {
      uVar11 = uVar12;
      if (uVar12 < (this->geometries).size_active) {
        do {
          pGVar1 = (this->geometries).items[uVar11].ptr;
          if (pGVar1 != (Geometry *)0x0) {
            (*(pGVar1->super_RefCount)._vptr_RefCount[3])();
          }
          uVar11 = uVar11 + 1;
        } while (uVar11 < (this->geometries).size_active);
      }
      (this->geometries).size_active = uVar12;
    }
    if ((this->geometries).size_alloced == uVar10) {
      uVar11 = (this->geometries).size_active;
      if (uVar11 < uVar12) {
        do {
          (this->geometries).items[uVar11].ptr = (Geometry *)0x0;
          uVar11 = uVar11 + 1;
        } while (uVar12 != uVar11);
      }
      (this->geometries).size_active = uVar12;
    }
    else {
      pDVar2 = (this->geometries).alloc.device;
      pRVar4 = (this->geometries).items;
      iVar6 = (*(pDVar2->super_State).super_RefCount._vptr_RefCount[8])(pDVar2,uVar10 * 8,8);
      (this->geometries).items = (Ref<embree::Geometry> *)CONCAT44(extraout_var,iVar6);
      uVar11 = (this->geometries).size_active;
      if (uVar11 != 0) {
        uVar9 = 0;
        do {
          (this->geometries).items[uVar9].ptr = pRVar4[uVar9].ptr;
          pRVar4[uVar9].ptr = (Geometry *)0x0;
          uVar9 = uVar9 + 1;
          uVar11 = (this->geometries).size_active;
        } while (uVar9 < uVar11);
      }
      if (uVar11 < uVar12) {
        do {
          (this->geometries).items[uVar11].ptr = (Geometry *)0x0;
          uVar11 = uVar11 + 1;
        } while (uVar12 != uVar11);
      }
      pDVar2 = (this->geometries).alloc.device;
      if (pDVar2 != (Device *)0x0) {
        (*(pDVar2->super_State).super_RefCount._vptr_RefCount[9])(pDVar2,pRVar4);
      }
      (this->geometries).size_active = uVar12;
      (this->geometries).size_alloced = uVar10;
    }
    uVar11 = (this->vertices).size_alloced;
    uVar9 = uVar11;
    if ((uVar11 < uVar12) && (uVar9 = uVar12, uVar11 != 0)) {
      while (uVar9 = uVar11, uVar9 < uVar12) {
        uVar11 = uVar9 * 2 + (ulong)(uVar9 * 2 == 0);
      }
    }
    if (uVar12 < (this->vertices).size_active) {
      (this->vertices).size_active = uVar12;
    }
    if ((this->vertices).size_alloced == uVar9) {
      (this->vertices).size_active = uVar12;
    }
    else {
      pDVar2 = (this->vertices).alloc.device;
      ppfVar3 = (this->vertices).items;
      iVar6 = (*(pDVar2->super_State).super_RefCount._vptr_RefCount[8])(pDVar2,uVar9 * 8,8,3);
      (this->vertices).items = (float **)CONCAT44(extraout_var_00,iVar6);
      if ((this->vertices).size_active != 0) {
        uVar11 = 0;
        do {
          (this->vertices).items[uVar11] = ppfVar3[uVar11];
          uVar11 = uVar11 + 1;
        } while (uVar11 < (this->vertices).size_active);
      }
      pDVar2 = (this->vertices).alloc.device;
      if (pDVar2 != (Device *)0x0) {
        (*(pDVar2->super_State).super_RefCount._vptr_RefCount[9])(pDVar2,ppfVar3);
      }
      (this->vertices).size_active = uVar12;
      (this->vertices).size_alloced = uVar9;
    }
    uVar11 = (this->geometryModCounters_).size_alloced;
    uVar9 = uVar11;
    if ((uVar11 < uVar12) && (uVar9 = uVar12, uVar11 != 0)) {
      while (uVar9 = uVar11, uVar9 < uVar12) {
        uVar11 = uVar9 * 2 + (ulong)(uVar9 * 2 == 0);
      }
    }
    if (uVar12 < (this->geometryModCounters_).size_active) {
      (this->geometryModCounters_).size_active = uVar12;
    }
    if ((this->geometryModCounters_).size_alloced == uVar9) {
      (this->geometryModCounters_).size_active = uVar12;
    }
    else {
      ptr = (this->geometryModCounters_).items;
      puVar8 = (uint *)alignedMalloc(uVar9 * 4,4);
      (this->geometryModCounters_).items = puVar8;
      if ((this->geometryModCounters_).size_active != 0) {
        uVar11 = 0;
        do {
          (this->geometryModCounters_).items[uVar11] = ptr[uVar11];
          uVar11 = uVar11 + 1;
        } while (uVar11 < (this->geometryModCounters_).size_active);
      }
      alignedFree(ptr);
      (this->geometryModCounters_).size_active = uVar12;
      (this->geometryModCounters_).size_alloced = uVar9;
    }
  }
  pRVar4 = (this->geometries).items;
  if (*(long **)__addr != (long *)0x0) {
    (**(code **)(**(long **)__addr + 0x10))();
  }
  pGVar1 = pRVar4[uVar13].ptr;
  if (pGVar1 != (Geometry *)0x0) {
    (*(pGVar1->super_RefCount)._vptr_RefCount[3])();
  }
  pRVar4[uVar13].ptr = *(Geometry **)__addr;
  (this->geometryModCounters_).items[uVar13] = 0;
  if ((*(byte *)(*(long *)__addr + 0x3e) & 0x20) != 0) {
    this->modified = true;
  }
  if (local_38 == '\x01') {
    MutexSys::unlock(local_40);
  }
  return __fd;
}

Assistant:

unsigned Scene::bind(unsigned geomID, Ref<Geometry> geometry) 
  {
    Lock<MutexSys> lock(geometriesMutex);
    if (geomID == RTC_INVALID_GEOMETRY_ID) {
      geomID = id_pool.allocate();
      if (geomID == RTC_INVALID_GEOMETRY_ID)
        throw_RTCError(RTC_ERROR_INVALID_OPERATION,"too many geometries inside scene");
    }
    else
    {
      if (!id_pool.add(geomID))
        throw_RTCError(RTC_ERROR_INVALID_OPERATION,"invalid geometry ID provided");
    }
    if (geomID >= geometries.size()) {
      geometries.resize(geomID+1);
      vertices.resize(geomID+1);
      geometryModCounters_.resize(geomID+1);
    }
    geometries[geomID] = geometry;
    geometryModCounters_[geomID] = 0;
    if (geometry->isEnabled()) {
      setModified ();
    }
    return geomID;
  }